

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O0

bool __thiscall
SkeletalMesh::Scene::setShaderInput
          (Scene *this,GLuint program,string *posiName,string *texcName,string *normName,
          string *bnidName,string *bnwtName)

{
  PFNGLGETATTRIBLOCATIONPROC p_Var1;
  GLuint GVar2;
  GLchar *pGVar3;
  GLint bnwtLoc;
  GLint bnidLoc;
  GLint normLoc;
  GLint texcLoc;
  GLint posiLoc;
  ParametricVertex example;
  string *bnidName_local;
  string *normName_local;
  string *texcName_local;
  string *posiName_local;
  GLuint program_local;
  Scene *this_local;
  
  if ((this->available & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    example.boneWeight._8_8_ = bnidName;
    ParametricVertex::ParametricVertex((ParametricVertex *)&texcLoc);
    (*__glewBindVertexArray)(this->vao);
    (*__glewBindBuffer)(0x8892,this->vbo);
    p_Var1 = __glewGetAttribLocation;
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    GVar2 = (*p_Var1)(program,pGVar3);
    if (-1 < (int)GVar2) {
      (*__glewEnableVertexAttribArray)(GVar2);
      (*__glewVertexAttribPointer)(GVar2,3,0x1406,'\0',0x40,(void *)0x0);
    }
    p_Var1 = __glewGetAttribLocation;
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    GVar2 = (*p_Var1)(program,pGVar3);
    if (-1 < (int)GVar2) {
      (*__glewEnableVertexAttribArray)(GVar2);
      (*__glewVertexAttribPointer)(GVar2,2,0x1406,'\0',0x40,(void *)0xc);
    }
    p_Var1 = __glewGetAttribLocation;
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    GVar2 = (*p_Var1)(program,pGVar3);
    if (-1 < (int)GVar2) {
      (*__glewEnableVertexAttribArray)(GVar2);
      (*__glewVertexAttribPointer)(GVar2,3,0x1406,'\0',0x40,(void *)0x14);
    }
    p_Var1 = __glewGetAttribLocation;
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    GVar2 = (*p_Var1)(program,pGVar3);
    if (-1 < (int)GVar2) {
      (*__glewEnableVertexAttribArray)(GVar2);
      (*__glewVertexAttribIPointer)(GVar2,4,0x1404,0x40,(void *)0x20);
    }
    p_Var1 = __glewGetAttribLocation;
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    GVar2 = (*p_Var1)(program,pGVar3);
    if (-1 < (int)GVar2) {
      (*__glewEnableVertexAttribArray)(GVar2);
      (*__glewVertexAttribPointer)(GVar2,4,0x1406,'\0',0x40,(void *)0x30);
    }
    (*__glewBindVertexArray)(0);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool setShaderInput(GLuint program,
                            std::string posiName, std::string texcName, std::string normName,
                            std::string bnidName, std::string bnwtName) {
            if (!available) return false;

            ParametricVertex example;

            glBindVertexArray(vao);
            glBindBuffer(GL_ARRAY_BUFFER, vbo);

            {
                GLint posiLoc = glGetAttribLocation(program, posiName.c_str());
                if (posiLoc >= 0) {
                    glEnableVertexAttribArray(posiLoc);
                    glVertexAttribPointer(posiLoc, 3, GL_FLOAT, GL_FALSE, sizeof(ParametricVertex),
                                          (const void *) ((char *) example.position - (char *) &example));
                }
            }
            {
                GLint texcLoc = glGetAttribLocation(program, texcName.c_str());
                if (texcLoc >= 0) {
                    glEnableVertexAttribArray(texcLoc);
                    glVertexAttribPointer(texcLoc, 2, GL_FLOAT, GL_FALSE, sizeof(ParametricVertex),
                                          (const void *) ((char *) example.texcoord - (char *) &example));
                }
            }
            {
                GLint normLoc = glGetAttribLocation(program, normName.c_str());
                if (normLoc >= 0) {
                    glEnableVertexAttribArray(normLoc);
                    glVertexAttribPointer(normLoc, 3, GL_FLOAT, GL_FALSE, sizeof(ParametricVertex),
                                          (const void *) ((char *) example.normal - (char *) &example));
                }
            }
            {
                GLint bnidLoc = glGetAttribLocation(program, bnidName.c_str());
                if (bnidLoc >= 0) {
                    glEnableVertexAttribArray(bnidLoc);
                    glVertexAttribIPointer(bnidLoc, SCENE_RESOURCE_BONE_PER_VERTEX, GL_INT, sizeof(ParametricVertex),
                                           (const void *) ((char *) example.boneId - (char *) &example));
                }
            }
            {
                GLint bnwtLoc = glGetAttribLocation(program, bnwtName.c_str());
                if (bnwtLoc >= 0) {
                    glEnableVertexAttribArray(bnwtLoc);
                    glVertexAttribPointer(bnwtLoc, SCENE_RESOURCE_BONE_PER_VERTEX, GL_FLOAT, GL_FALSE,
                                          sizeof(ParametricVertex),
                                          (const void *) ((char *) example.boneWeight - (char *) &example));
                }
            }

            glBindVertexArray(0);

            return true;
        }